

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

void big2_updatePosition(ENCODING *enc,char *ptr,char *end,POSITION *pos)

{
  byte *pbVar1;
  byte bVar2;
  XML_Size XVar3;
  undefined1 uVar4;
  bool bVar5;
  
  if (1 < (long)end - (long)ptr) {
    XVar3 = pos->columnNumber;
    do {
      bVar2 = *ptr;
      if (bVar2 < 0xdc) {
        uVar4 = 7;
        if (3 < bVar2 - 0xd8) {
          if (bVar2 == 0) {
            uVar4 = *(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]);
          }
          else {
LAB_004e6771:
            uVar4 = 0x1d;
          }
        }
      }
      else if (bVar2 - 0xdc < 4) {
        uVar4 = 8;
      }
      else {
        if ((bVar2 != 0xff) || (((byte *)ptr)[1] < 0xfe)) goto LAB_004e6771;
        uVar4 = 0;
      }
      switch(uVar4) {
      default:
        ptr = (char *)((byte *)ptr + 2);
        break;
      case 6:
        ptr = (char *)((byte *)ptr + 3);
        break;
      case 7:
        ptr = (char *)((byte *)ptr + 4);
        break;
      case 9:
        pos->lineNumber = pos->lineNumber + 1;
        pbVar1 = (byte *)ptr + 2;
        if (1 < (long)end - (long)pbVar1) {
          if (*pbVar1 == 0) {
            bVar5 = *(char *)((long)enc[1].scanners + (ulong)((byte *)ptr)[3]) == '\n';
          }
          else {
            bVar5 = false;
          }
          if (bVar5) {
            pbVar1 = (byte *)ptr + 4;
          }
        }
        ptr = (char *)pbVar1;
        pos->columnNumber = 0xffffffffffffffff;
        XVar3 = 0xffffffffffffffff;
        break;
      case 10:
        pos->columnNumber = 0xffffffffffffffff;
        pos->lineNumber = pos->lineNumber + 1;
        ptr = (char *)((byte *)ptr + 2);
        XVar3 = 0xffffffffffffffff;
      }
      XVar3 = XVar3 + 1;
      pos->columnNumber = XVar3;
    } while (1 < (long)end - (long)ptr);
  }
  return;
}

Assistant:

static void PTRCALL
PREFIX(updatePosition)(const ENCODING *enc,
                       const char *ptr,
                       const char *end,
                       POSITION *pos)
{
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_LF:
      pos->columnNumber = (XML_Size)-1;
      pos->lineNumber++;
      ptr += MINBPC(enc);
      break;
    case BT_CR:
      pos->lineNumber++;
      ptr += MINBPC(enc);
      if (HAS_CHAR(enc, ptr, end) && BYTE_TYPE(enc, ptr) == BT_LF)
        ptr += MINBPC(enc);
      pos->columnNumber = (XML_Size)-1;
      break;
    default:
      ptr += MINBPC(enc);
      break;
    }
    pos->columnNumber++;
  }
}